

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string field_name;
  
  UnderscoresToCamelCase(&field_name,*(string **)this,true);
  std::operator+(&bStack_78,"k",&field_name);
  std::operator+(__return_storage_ptr__,&bStack_78,"FieldNumber");
  std::__cxx11::string::~string((string *)&bStack_78);
  if (this[0x50] == (cpp)0x0) {
    pFVar1 = Descriptor::FindFieldByCamelcaseName
                       (*(Descriptor **)(this + 0x58),*(string **)(this + 0x18));
    if (pFVar1 != (FieldDescriptor *)this) {
      SimpleItoa_abi_cxx11_(&local_58,(protobuf *)(ulong)*(uint *)(this + 0x38),i);
      std::operator+(&bStack_78,"_",&local_58);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&field_name);
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string field_name = UnderscoresToCamelCase(field->name(), true);
  string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
        field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + SimpleItoa(field->number());
  }

  return result;
}